

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_AfterProtocMaximumEditionError_Test::
~CommandLineInterfaceTest_AfterProtocMaximumEditionError_Test
          (CommandLineInterfaceTest_AfterProtocMaximumEditionError_Test *this)

{
  CommandLineInterfaceTester::~CommandLineInterfaceTester((CommandLineInterfaceTester *)this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, AfterProtocMaximumEditionError) {
  CreateTempFile("foo.proto",
                 R"schema(
    edition = "2024";
    package foo;
    message Foo {
    }
  )schema");

  Run("protocol_compiler --proto_path=$tmpdir --test_out=$tmpdir foo.proto");
  ExpectErrorSubstring(
      "foo.proto: is a file using edition 2024, which is later than the protoc "
      "maximum supported edition 2023.");
}